

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_bolelli_2018.h
# Opt level: O1

void __thiscall DRAG<UF>::PerformLabeling(DRAG<UF> *this)

{
  long lVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  Mat1b *pMVar5;
  Mat1i *pMVar6;
  long lVar7;
  uint *puVar8;
  uint *puVar9;
  uint uVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  undefined4 uVar14;
  uint uVar16;
  int iVar17;
  ulong uVar18;
  ulong uVar19;
  uint uVar20;
  long lVar21;
  ulong uVar22;
  long lVar23;
  ulong uVar24;
  ulong uVar25;
  long lVar26;
  uint uVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  uint local_e8;
  Mat local_90 [96];
  ulong uVar15;
  
  pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  uVar10 = *(uint *)&pMVar5->field_0x8;
  uVar19 = (ulong)uVar10;
  iVar17 = *(int *)&pMVar5->field_0xc;
  lVar28 = (long)iVar17;
  cv::Mat::Mat(local_90,**(int **)&pMVar5->field_0x40,(*(int **)&pMVar5->field_0x40)[1],4);
  cv::Mat::operator=(&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat,
                     local_90);
  cv::Mat::~Mat(local_90);
  pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar2 = *(int *)&pMVar5->field_0x8;
  iVar3 = *(int *)&pMVar5->field_0xc;
  UF::P_ = (uint *)operator_new__((ulong)(((iVar3 - (iVar3 + 1 >> 0x1f)) + 1 >> 1) *
                                          ((iVar2 - (iVar2 + 1 >> 0x1f)) + 1 >> 1) + 1) << 2);
  *UF::P_ = 0;
  UF::length_ = 1;
  if (0 < (int)uVar10) {
    pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
    pMVar6 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
    lVar29 = *(long *)&pMVar5->field_0x10;
    lVar11 = **(long **)&pMVar5->field_0x48;
    lVar21 = *(long *)&pMVar6->field_0x10;
    lVar7 = **(long **)&pMVar6->field_0x48;
    uVar25 = 0;
    do {
      puVar8 = UF::P_;
      if (0 < iVar17) {
        lVar30 = lVar11 * uVar25 + lVar29;
        lVar1 = lVar30 + -lVar11;
        lVar12 = -lVar11 + lVar1;
        lVar26 = lVar30 + lVar11;
        lVar23 = lVar7 * uVar25 + lVar21;
        lVar13 = lVar23 + lVar7 * -2;
        uVar22 = uVar25 | 1;
        uVar24 = 0;
        do {
          if (*(char *)(lVar30 + uVar24) == '\0') {
            if ((uVar22 < uVar19) && (*(char *)(lVar26 + uVar24) != '\0')) {
              uVar18 = uVar24 | 1;
              if (((long)uVar18 < lVar28) && (*(char *)(lVar30 + uVar18) != '\0')) {
                if (uVar24 == 0) {
LAB_001149fc:
                  if (((uVar25 == 0) || (lVar28 <= (long)(uVar24 | 1))) ||
                     (*(char *)(lVar1 + (uVar24 | 1)) == '\0')) {
                    if (((uVar25 != 0) && ((long)(uVar24 + 2) < lVar28)) &&
                       (*(char *)(lVar1 + uVar24 + 2) != '\0')) {
                      if (*(char *)(lVar1 + uVar24) == '\0') goto LAB_00114e73;
                      goto LAB_00114bf8;
                    }
                    if ((uVar25 == 0) || (*(char *)(lVar1 + uVar24) == '\0')) goto LAB_00114cb6;
                  }
                  goto LAB_00114c44;
                }
                if (*(char *)((uVar24 - 1) + lVar30) != '\0') {
                  if ((uVar25 == 0) || (*(char *)(lVar1 + uVar18) == '\0')) goto LAB_00114a60;
                  goto LAB_00114946;
                }
                if (*(char *)(lVar26 + -1 + uVar24) == '\0') goto LAB_001149fc;
                if ((uVar25 == 0) || (*(char *)(lVar1 + uVar18) == '\0')) {
                  if (((uVar25 == 0) || (lVar28 <= (long)(uVar24 + 2))) ||
                     (*(char *)(lVar1 + uVar24 + 2) == '\0')) {
                    if ((uVar25 == 0) || (*(char *)(lVar1 + uVar24) == '\0')) goto LAB_00114f99;
                    if (*(char *)((uVar24 - 2) + lVar30) == '\0') {
                      uVar10 = *(uint *)(lVar13 + uVar24 * 4);
                      do {
                        uVar16 = uVar10;
                        uVar10 = puVar8[uVar16];
                        uVar20 = *(uint *)(lVar23 + -8 + uVar24 * 4);
                      } while (puVar8[uVar16] < uVar16);
                      do {
                        uVar10 = uVar20;
                        uVar20 = puVar8[uVar10];
                      } while (puVar8[uVar10] < uVar10);
                      goto LAB_0011530d;
                    }
                    goto LAB_0011496a;
                  }
                  if (*(char *)(lVar12 + uVar18) == '\0') {
                    if (*(char *)(lVar1 + uVar24) == '\0') {
                      uVar10 = *(uint *)(lVar13 + 8 + uVar24 * 4);
                      do {
                        uVar16 = uVar10;
                        uVar10 = puVar8[uVar16];
                        uVar20 = *(uint *)(lVar23 + -8 + uVar24 * 4);
                      } while (puVar8[uVar16] < uVar16);
                      do {
                        uVar10 = uVar20;
                        uVar20 = puVar8[uVar10];
                      } while (puVar8[uVar10] < uVar10);
                    }
                    else {
                      if (*(char *)((uVar24 - 2) + lVar30) == '\0') {
                        uVar10 = *(uint *)(lVar13 + uVar24 * 4);
                        do {
                          uVar20 = uVar10;
                          uVar10 = puVar8[uVar20];
                          uVar16 = *(uint *)(lVar13 + 8 + uVar24 * 4);
                        } while (puVar8[uVar20] < uVar20);
                        do {
                          uVar10 = uVar16;
                          uVar16 = puVar8[uVar10];
                        } while (puVar8[uVar10] < uVar10);
                        uVar16 = uVar10;
                        if (uVar20 >= uVar10 && uVar20 != uVar10) {
                          uVar16 = uVar20;
                        }
                        if (uVar20 < uVar10) {
                          uVar10 = uVar20;
                        }
                        puVar8[uVar16] = uVar10;
                        do {
                          uVar16 = uVar10;
                          uVar20 = *(uint *)(lVar23 + -8 + uVar24 * 4);
                          uVar10 = puVar8[uVar16];
                        } while (puVar8[uVar16] < uVar16);
                        do {
                          uVar10 = uVar20;
                          uVar20 = puVar8[uVar10];
                        } while (puVar8[uVar10] < uVar10);
                        goto LAB_001153b3;
                      }
                      if (*(char *)(lVar1 + -1 + uVar24) == '\0') goto LAB_0011522f;
                      uVar10 = *(uint *)(lVar13 + -8 + uVar24 * 4);
                      do {
                        uVar16 = uVar10;
                        uVar10 = puVar8[uVar16];
                        uVar20 = *(uint *)(lVar13 + 8 + uVar24 * 4);
                      } while (puVar8[uVar16] < uVar16);
                      do {
                        uVar10 = uVar20;
                        uVar20 = puVar8[uVar10];
                      } while (puVar8[uVar10] < uVar10);
                    }
                    goto LAB_0011530d;
                  }
                }
                if (*(char *)((uVar24 - 2) + lVar30) == '\0') {
                  uVar10 = *(uint *)(lVar13 + uVar24 * 4);
                  do {
                    uVar16 = uVar10;
                    uVar10 = puVar8[uVar16];
                    uVar20 = *(uint *)(lVar23 + -8 + uVar24 * 4);
                  } while (puVar8[uVar16] < uVar16);
                  do {
                    uVar10 = uVar20;
                    uVar20 = puVar8[uVar10];
                  } while (puVar8[uVar10] < uVar10);
                  goto LAB_0011530d;
                }
LAB_00114afd:
                if ((uVar24 == 0 || uVar25 == 0) || (*(char *)(lVar1 + -1 + uVar24) == '\0')) {
LAB_00114b1c:
                  if ((uVar24 == 0 || uVar25 == 0) || (*(char *)(lVar1 + -2 + uVar24) == '\0')) {
                    uVar10 = *(uint *)(lVar13 + uVar24 * 4);
                    do {
                      uVar16 = uVar10;
                      uVar10 = puVar8[uVar16];
                      uVar20 = *(uint *)(lVar23 + -8 + uVar24 * 4);
                    } while (puVar8[uVar16] < uVar16);
                    do {
                      uVar10 = uVar20;
                      uVar20 = puVar8[uVar10];
                    } while (puVar8[uVar10] < uVar10);
                  }
                  else {
                    if (*(char *)(lVar12 + -1 + uVar24) != '\0') goto LAB_00114d3a;
                    uVar10 = *(uint *)(lVar13 + -8 + uVar24 * 4);
                    do {
                      uVar16 = uVar10;
                      uVar10 = puVar8[uVar16];
                      uVar20 = *(uint *)(lVar13 + uVar24 * 4);
                    } while (puVar8[uVar16] < uVar16);
                    do {
                      uVar10 = uVar20;
                      uVar20 = puVar8[uVar10];
                    } while (puVar8[uVar10] < uVar10);
                  }
                  goto LAB_0011530d;
                }
LAB_00114d3a:
                if (uVar25 != 0) {
                  if (*(char *)(lVar1 + uVar24) != '\0') goto LAB_00114c68;
                  goto LAB_00114bad;
                }
LAB_00114d96:
                uVar10 = *(uint *)(lVar13 + -8 + uVar24 * 4);
                do {
                  uVar16 = uVar10;
                  uVar10 = puVar8[uVar16];
                  uVar20 = *(uint *)(lVar13 + uVar24 * 4);
                } while (puVar8[uVar16] < uVar16);
                do {
                  uVar10 = uVar20;
                  uVar20 = puVar8[uVar10];
                } while (puVar8[uVar10] < uVar10);
                goto LAB_0011530d;
              }
              if ((uVar24 != 0) &&
                 ((*(char *)((uVar24 - 1) + lVar26) != '\0' ||
                  (*(char *)(lVar30 + -1 + uVar24) != '\0')))) goto LAB_00114f99;
LAB_00114cb6:
              puVar8[UF::length_] = UF::length_;
              uVar10 = UF::length_ + 1;
              *(uint *)(lVar23 + uVar24 * 4) = UF::length_;
              UF::length_ = uVar10;
            }
            else {
              uVar18 = uVar24 | 1;
              if ((long)uVar18 < lVar28) {
                if (*(char *)(lVar30 + uVar18) != '\0') goto LAB_001149fc;
                if ((uVar22 < uVar19) && (*(char *)(lVar26 + uVar18) != '\0')) goto LAB_00114cb6;
              }
              *(undefined4 *)(lVar23 + uVar24 * 4) = 0;
            }
          }
          else {
            if (uVar24 == 0) {
LAB_00114b73:
              uVar18 = uVar24 | 1;
              if ((uVar25 == 0) || ((lVar28 <= (long)uVar18 || (*(char *)(lVar1 + uVar18) == '\0')))
                 ) {
                if (((long)uVar18 < lVar28) &&
                   ((((*(char *)(lVar30 + uVar18) != '\0' && (uVar25 != 0)) &&
                     ((long)(uVar24 + 2) < lVar28)) && (*(char *)(lVar1 + uVar24 + 2) != '\0')))) {
                  if (*(char *)(lVar1 + uVar24) == '\0') {
                    if ((uVar24 == 0) || (*(char *)(lVar1 + -1 + uVar24) == '\0')) {
LAB_00114e73:
                      uVar10 = *(uint *)(lVar13 + 8 + uVar24 * 4);
                      goto LAB_00114f9e;
                    }
                    if (*(char *)(lVar12 + uVar18) != '\0') goto LAB_00114bad;
                    uVar10 = *(uint *)(lVar13 + -8 + uVar24 * 4);
                    do {
                      uVar16 = uVar10;
                      uVar10 = puVar8[uVar16];
                      uVar20 = *(uint *)(lVar13 + 8 + uVar24 * 4);
                    } while (puVar8[uVar16] < uVar16);
                    do {
                      uVar10 = uVar20;
                      uVar20 = puVar8[uVar10];
                    } while (puVar8[uVar10] < uVar10);
                  }
                  else {
LAB_00114bf8:
                    if (((uVar25 != 0) && ((long)(uVar24 | 1) < lVar28)) &&
                       (*(char *)(lVar12 + (uVar24 | 1)) != '\0')) goto LAB_00114c44;
                    uVar10 = *(uint *)(lVar13 + uVar24 * 4);
                    do {
                      uVar16 = uVar10;
                      uVar10 = puVar8[uVar16];
                      uVar20 = *(uint *)(lVar13 + 8 + uVar24 * 4);
                    } while (puVar8[uVar16] < uVar16);
                    do {
                      uVar10 = uVar20;
                      uVar20 = puVar8[uVar10];
                    } while (puVar8[uVar10] < uVar10);
                  }
LAB_0011530d:
                  uVar20 = uVar10;
                  if (uVar10 < uVar16) {
                    uVar20 = uVar16;
                  }
                  if (uVar16 < uVar10) {
                    uVar10 = uVar16;
                  }
                  puVar8[uVar20] = uVar10;
                  goto LAB_0011531a;
                }
                if ((uVar25 != 0) && (*(char *)(lVar1 + uVar24) != '\0')) goto LAB_00114c44;
                if ((uVar25 == 0 || uVar24 == 0) || (*(char *)(lVar1 + -1 + uVar24) == '\0'))
                goto LAB_00114cb6;
              }
              else {
                if (((*(char *)(lVar1 + uVar24) != '\0') || (uVar24 == 0)) ||
                   (*(char *)(lVar1 + -1 + uVar24) == '\0')) {
LAB_00114c44:
                  uVar10 = *(uint *)(lVar13 + uVar24 * 4);
                  goto LAB_00114f9e;
                }
LAB_00114bad:
                if ((uVar25 == 0) || (*(char *)(lVar12 + uVar24) == '\0')) goto LAB_00114d96;
              }
LAB_00114c68:
              uVar10 = *(uint *)(lVar13 + -8 + uVar24 * 4);
            }
            else {
              if (*(char *)(lVar30 + -1 + uVar24) == '\0') {
                if ((uVar19 <= uVar22) || (*(char *)(lVar26 + -1 + uVar24) == '\0'))
                goto LAB_00114b73;
                uVar18 = uVar24 | 1;
                if (((uVar25 != 0) && ((long)uVar18 < lVar28)) &&
                   (*(char *)(lVar1 + uVar18) != '\0')) {
                  if (*(char *)((uVar24 - 2) + lVar30) != '\0') goto LAB_00114afd;
                  if (*(char *)(lVar1 + uVar24) == '\0') {
                    if (*(char *)(lVar1 + -1 + uVar24) == '\0') {
                      uVar10 = *(uint *)(lVar13 + uVar24 * 4);
                      do {
                        uVar16 = uVar10;
                        uVar10 = puVar8[uVar16];
                        uVar20 = *(uint *)(lVar23 + -8 + uVar24 * 4);
                      } while (puVar8[uVar16] < uVar16);
                      do {
                        uVar10 = uVar20;
                        uVar20 = puVar8[uVar10];
                      } while (puVar8[uVar10] < uVar10);
                    }
                    else {
LAB_00114fc0:
                      if ((uVar25 == 0) || (*(char *)(lVar12 + uVar24) == '\0')) {
                        uVar10 = *(uint *)(lVar13 + -8 + uVar24 * 4);
                        do {
                          uVar20 = uVar10;
                          uVar10 = puVar8[uVar20];
                          uVar16 = *(uint *)(lVar13 + uVar24 * 4);
                        } while (puVar8[uVar20] < uVar20);
                        do {
                          uVar10 = uVar16;
                          uVar16 = puVar8[uVar10];
                        } while (puVar8[uVar10] < uVar10);
                        uVar16 = uVar10;
                        if (uVar20 >= uVar10 && uVar20 != uVar10) {
                          uVar16 = uVar20;
                        }
                        if (uVar20 < uVar10) {
                          uVar10 = uVar20;
                        }
                        puVar8[uVar16] = uVar10;
                        do {
                          uVar16 = uVar10;
                          uVar20 = *(uint *)(lVar23 + -8 + uVar24 * 4);
                          uVar10 = puVar8[uVar16];
                        } while (puVar8[uVar16] < uVar16);
                        do {
                          uVar10 = uVar20;
                          uVar20 = puVar8[uVar10];
                        } while (puVar8[uVar10] < uVar10);
                        uVar18 = (ulong)uVar10;
                        if (uVar16 >= uVar10 && uVar16 != uVar10) {
                          uVar18 = (ulong)uVar16;
                        }
                        if (uVar16 < uVar10) {
                          uVar10 = uVar16;
                        }
                        puVar8[uVar18] = uVar10;
                        goto LAB_00114f9e;
                      }
                      uVar10 = *(uint *)(lVar13 + -8 + uVar24 * 4);
                      do {
                        uVar16 = uVar10;
                        uVar10 = puVar8[uVar16];
                        uVar20 = *(uint *)(lVar23 + -8 + uVar24 * 4);
                      } while (puVar8[uVar16] < uVar16);
                      do {
                        uVar10 = uVar20;
                        uVar20 = puVar8[uVar10];
                      } while (puVar8[uVar10] < uVar10);
                    }
                  }
                  else {
                    uVar10 = *(uint *)(lVar13 + uVar24 * 4);
                    do {
                      uVar16 = uVar10;
                      uVar10 = puVar8[uVar16];
                      uVar20 = *(uint *)(lVar23 + -8 + uVar24 * 4);
                    } while (puVar8[uVar16] < uVar16);
                    do {
                      uVar10 = uVar20;
                      uVar20 = puVar8[uVar10];
                    } while (puVar8[uVar10] < uVar10);
                  }
                  goto LAB_0011530d;
                }
                if (((((long)uVar18 < lVar28) && (*(char *)(lVar30 + uVar18) != '\0')) &&
                    (uVar25 != 0)) &&
                   (((long)(uVar24 + 2) < lVar28 && (*(char *)(lVar1 + uVar24 + 2) != '\0')))) {
                  if (*(char *)((uVar24 - 2) + lVar30) == '\0') {
                    if (*(char *)(lVar1 + uVar24) == '\0') {
                      if (*(char *)(lVar1 + -1 + uVar24) == '\0') {
                        uVar10 = *(uint *)(lVar13 + 8 + uVar24 * 4);
                        do {
                          uVar16 = uVar10;
                          uVar10 = puVar8[uVar16];
                          uVar20 = *(uint *)(lVar23 + -8 + uVar24 * 4);
                        } while (puVar8[uVar16] < uVar16);
                        do {
                          uVar10 = uVar20;
                          uVar20 = puVar8[uVar10];
                        } while (puVar8[uVar10] < uVar10);
                        goto LAB_0011530d;
                      }
                      if (*(char *)(lVar12 + uVar18) != '\0') goto LAB_00114fc0;
                      uVar10 = *(uint *)(lVar13 + -8 + uVar24 * 4);
                      do {
                        uVar20 = uVar10;
                        uVar10 = puVar8[uVar20];
                        uVar16 = *(uint *)(lVar13 + 8 + uVar24 * 4);
                      } while (puVar8[uVar20] < uVar20);
                      do {
                        uVar10 = uVar16;
                        uVar16 = puVar8[uVar10];
                      } while (puVar8[uVar10] < uVar10);
                      uVar16 = uVar10;
                      if (uVar20 >= uVar10 && uVar20 != uVar10) {
                        uVar16 = uVar20;
                      }
                      if (uVar20 < uVar10) {
                        uVar10 = uVar20;
                      }
                      puVar8[uVar16] = uVar10;
                      do {
                        uVar16 = uVar10;
                        uVar20 = *(uint *)(lVar23 + -8 + uVar24 * 4);
                        uVar10 = puVar8[uVar16];
                      } while (puVar8[uVar16] < uVar16);
                      do {
                        uVar10 = uVar20;
                        uVar20 = puVar8[uVar10];
                      } while (puVar8[uVar10] < uVar10);
                    }
                    else {
                      uVar10 = *(uint *)(lVar13 + uVar24 * 4);
                      if (*(char *)(lVar12 + uVar18) == '\0') {
                        do {
                          uVar20 = uVar10;
                          uVar10 = puVar8[uVar20];
                          uVar16 = *(uint *)(lVar13 + 8 + uVar24 * 4);
                        } while (puVar8[uVar20] < uVar20);
                        do {
                          uVar10 = uVar16;
                          uVar16 = puVar8[uVar10];
                        } while (puVar8[uVar10] < uVar10);
                        uVar16 = uVar10;
                        if (uVar20 >= uVar10 && uVar20 != uVar10) {
                          uVar16 = uVar20;
                        }
                        if (uVar20 < uVar10) {
                          uVar10 = uVar20;
                        }
                        puVar8[uVar16] = uVar10;
                        do {
                          uVar16 = uVar10;
                          uVar20 = *(uint *)(lVar23 + -8 + uVar24 * 4);
                          uVar10 = puVar8[uVar16];
                        } while (puVar8[uVar16] < uVar16);
                        do {
                          uVar10 = uVar20;
                          uVar20 = puVar8[uVar10];
                        } while (puVar8[uVar10] < uVar10);
                      }
                      else {
                        do {
                          uVar16 = uVar10;
                          uVar10 = puVar8[uVar16];
                          uVar20 = *(uint *)(lVar23 + -8 + uVar24 * 4);
                        } while (puVar8[uVar16] < uVar16);
                        do {
                          uVar10 = uVar20;
                          uVar20 = puVar8[uVar10];
                        } while (puVar8[uVar10] < uVar10);
                      }
                    }
                    goto LAB_001153b3;
                  }
                  if (*(char *)(lVar1 + -1 + uVar24) == '\0') {
                    if (*(char *)(lVar12 + uVar18) == '\0') {
                      if (*(char *)(lVar1 + uVar24) != '\0') {
LAB_0011522f:
                        if ((uVar24 == 0 || uVar25 == 0) || (*(char *)(lVar1 + -2 + uVar24) == '\0')
                           ) {
                          uVar10 = *(uint *)(lVar13 + uVar24 * 4);
                          do {
                            uVar20 = uVar10;
                            uVar10 = puVar8[uVar20];
                            uVar16 = *(uint *)(lVar13 + 8 + uVar24 * 4);
                          } while (puVar8[uVar20] < uVar20);
                          do {
                            uVar10 = uVar16;
                            uVar16 = puVar8[uVar10];
                          } while (puVar8[uVar10] < uVar10);
                          uVar16 = uVar10;
                          if (uVar20 >= uVar10 && uVar20 != uVar10) {
                            uVar16 = uVar20;
                          }
                          if (uVar20 < uVar10) {
                            uVar10 = uVar20;
                          }
                          puVar8[uVar16] = uVar10;
                          do {
                            uVar16 = uVar10;
                            uVar20 = *(uint *)(lVar23 + -8 + uVar24 * 4);
                            uVar10 = puVar8[uVar16];
                          } while (puVar8[uVar16] < uVar16);
                          do {
                            uVar10 = uVar20;
                            uVar20 = puVar8[uVar10];
                          } while (puVar8[uVar10] < uVar10);
                        }
                        else {
                          if (*(char *)(lVar12 + -1 + uVar24) != '\0') {
                            uVar10 = *(uint *)(lVar13 + -8 + uVar24 * 4);
                            do {
                              uVar16 = uVar10;
                              uVar10 = puVar8[uVar16];
                              uVar20 = *(uint *)(lVar13 + 8 + uVar24 * 4);
                            } while (puVar8[uVar16] < uVar16);
                            do {
                              uVar10 = uVar20;
                              uVar20 = puVar8[uVar10];
                            } while (puVar8[uVar10] < uVar10);
                            goto LAB_0011530d;
                          }
                          uVar10 = *(uint *)(lVar13 + uVar24 * 4);
                          do {
                            uVar20 = uVar10;
                            uVar10 = puVar8[uVar20];
                            uVar16 = *(uint *)(lVar13 + 8 + uVar24 * 4);
                          } while (puVar8[uVar20] < uVar20);
                          do {
                            uVar10 = uVar16;
                            uVar16 = puVar8[uVar10];
                          } while (puVar8[uVar10] < uVar10);
                          uVar16 = uVar10;
                          if (uVar20 >= uVar10 && uVar20 != uVar10) {
                            uVar16 = uVar20;
                          }
                          if (uVar20 < uVar10) {
                            uVar10 = uVar20;
                          }
                          puVar8[uVar16] = uVar10;
                          do {
                            uVar16 = uVar10;
                            uVar20 = *(uint *)(lVar23 + -8 + uVar24 * 4);
                            uVar10 = puVar8[uVar16];
                          } while (puVar8[uVar16] < uVar16);
                          do {
                            uVar10 = uVar20;
                            uVar20 = puVar8[uVar10];
                          } while (puVar8[uVar10] < uVar10);
                        }
LAB_001153b3:
                        uVar20 = uVar10;
                        if (uVar10 < uVar16) {
                          uVar20 = uVar16;
                        }
                        if (uVar16 < uVar10) {
                          uVar10 = uVar16;
                        }
                        puVar8[uVar20] = uVar10;
                        *(uint *)(lVar23 + uVar24 * 4) = uVar10;
                        goto LAB_00114fa2;
                      }
                      uVar10 = *(uint *)(lVar13 + 8 + uVar24 * 4);
                      do {
                        uVar16 = uVar10;
                        uVar10 = puVar8[uVar16];
                        uVar20 = *(uint *)(lVar23 + -8 + uVar24 * 4);
                      } while (puVar8[uVar16] < uVar16);
                      do {
                        uVar10 = uVar20;
                        uVar20 = puVar8[uVar10];
                      } while (puVar8[uVar10] < uVar10);
                      goto LAB_0011530d;
                    }
                    goto LAB_00114b1c;
                  }
                  if (*(char *)(lVar12 + uVar18) == '\0') {
                    uVar10 = *(uint *)(lVar13 + -8 + uVar24 * 4);
                    do {
                      uVar16 = uVar10;
                      uVar10 = puVar8[uVar16];
                      uVar20 = *(uint *)(lVar13 + 8 + uVar24 * 4);
                    } while (puVar8[uVar16] < uVar16);
                    do {
                      uVar10 = uVar20;
                      uVar20 = puVar8[uVar10];
                    } while (puVar8[uVar10] < uVar10);
                    goto LAB_0011530d;
                  }
                  goto LAB_00114d3a;
                }
                if (uVar25 == 0) goto LAB_00114f99;
                if (*(char *)(lVar1 + -1 + uVar24) == '\0') {
                  if (*(char *)(lVar1 + uVar24) == '\0') goto LAB_00114f99;
                  if (*(char *)((uVar24 - 2) + lVar30) == '\0') {
                    uVar10 = *(uint *)(lVar13 + uVar24 * 4);
                    do {
                      uVar16 = uVar10;
                      uVar10 = puVar8[uVar16];
                      uVar20 = *(uint *)(lVar23 + -8 + uVar24 * 4);
                    } while (puVar8[uVar16] < uVar16);
                    do {
                      uVar10 = uVar20;
                      uVar20 = puVar8[uVar10];
                    } while (puVar8[uVar10] < uVar10);
                    goto LAB_0011530d;
                  }
                  goto LAB_00114e95;
                }
                uVar10 = *(uint *)(lVar13 + -8 + uVar24 * 4);
                if (*(char *)(lVar30 + -2 + uVar24) == '\0') {
                  do {
                    uVar16 = uVar10;
                    uVar20 = *(uint *)(lVar23 + -8 + uVar24 * 4);
                    uVar10 = puVar8[uVar16];
                  } while (puVar8[uVar16] < uVar16);
                  do {
                    uVar10 = uVar20;
                    uVar20 = puVar8[uVar10];
                  } while (puVar8[uVar10] < uVar10);
                  goto LAB_0011530d;
                }
LAB_0011531a:
                *(uint *)(lVar23 + uVar24 * 4) = uVar10;
                goto LAB_00114fa2;
              }
              uVar18 = uVar24 | 1;
              if (((uVar25 != 0) && ((long)uVar18 < lVar28)) && (*(char *)(lVar1 + uVar18) != '\0'))
              {
LAB_00114946:
                if (uVar25 == 0) {
LAB_00114ccb:
                  uVar10 = *(uint *)(lVar13 + uVar24 * 4);
                  do {
                    uVar16 = uVar10;
                    uVar10 = puVar8[uVar16];
                    uVar20 = *(uint *)(lVar23 + -8 + uVar24 * 4);
                  } while (puVar8[uVar16] < uVar16);
                  do {
                    uVar10 = uVar20;
                    uVar20 = puVar8[uVar10];
                  } while (puVar8[uVar10] < uVar10);
                  goto LAB_0011530d;
                }
                if (*(char *)(lVar1 + uVar24) != '\0') goto LAB_00114c44;
                if (*(char *)(lVar12 + uVar24) == '\0') goto LAB_00114ccb;
LAB_0011496a:
                if ((uVar24 == 0 || uVar25 == 0) || (*(char *)(lVar1 + -1 + uVar24) == '\0')) {
LAB_00114e95:
                  if ((uVar24 == 0 || uVar25 == 0) || (*(char *)(lVar1 + -2 + uVar24) == '\0')) {
                    uVar10 = *(uint *)(lVar13 + uVar24 * 4);
                    do {
                      uVar16 = uVar10;
                      uVar10 = puVar8[uVar16];
                      uVar20 = *(uint *)(lVar23 + -8 + uVar24 * 4);
                    } while (puVar8[uVar16] < uVar16);
                    do {
                      uVar10 = uVar20;
                      uVar20 = puVar8[uVar10];
                    } while (puVar8[uVar10] < uVar10);
                  }
                  else {
                    uVar10 = *(uint *)(lVar13 + -8 + uVar24 * 4);
                    if (*(char *)(lVar12 + -1 + uVar24) != '\0') goto LAB_0011531a;
                    do {
                      uVar16 = uVar10;
                      uVar20 = *(uint *)(lVar13 + uVar24 * 4);
                      uVar10 = puVar8[uVar16];
                    } while (puVar8[uVar16] < uVar16);
                    do {
                      uVar10 = uVar20;
                      uVar20 = puVar8[uVar10];
                    } while (puVar8[uVar10] < uVar10);
                  }
                  goto LAB_0011530d;
                }
                goto LAB_00114c68;
              }
              if (((long)uVar18 < lVar28) && (*(char *)(lVar30 + uVar18) != '\0')) {
LAB_00114a60:
                if ((uVar25 != 0) &&
                   (((long)(uVar24 + 2) < lVar28 && (*(char *)(lVar1 + uVar24 + 2) != '\0')))) {
                  if (*(char *)(lVar12 + 1 + uVar24) == '\0') {
                    uVar10 = *(uint *)(lVar13 + 8 + uVar24 * 4);
                    do {
                      uVar16 = uVar10;
                      uVar10 = puVar8[uVar16];
                      uVar20 = *(uint *)(lVar23 + -8 + uVar24 * 4);
                    } while (puVar8[uVar16] < uVar16);
                    do {
                      uVar10 = uVar20;
                      uVar20 = puVar8[uVar10];
                    } while (puVar8[uVar10] < uVar10);
                    goto LAB_0011530d;
                  }
                  goto LAB_00114946;
                }
              }
LAB_00114f99:
              uVar10 = *(uint *)(lVar23 + -8 + uVar24 * 4);
            }
LAB_00114f9e:
            *(uint *)(lVar23 + uVar24 * 4) = uVar10;
          }
LAB_00114fa2:
          uVar24 = uVar24 + 2;
        } while ((long)uVar24 < lVar28);
      }
      uVar25 = uVar25 + 2;
    } while (uVar25 < uVar19);
  }
  puVar8 = UF::P_;
  uVar10 = 1;
  if (1 < UF::length_) {
    uVar10 = 1;
    uVar19 = 1;
    do {
      if (puVar8[uVar19] < uVar19) {
        puVar8[uVar19] = puVar8[puVar8[uVar19]];
      }
      else {
        puVar8[uVar19] = uVar10;
        uVar10 = uVar10 + 1;
      }
      uVar19 = uVar19 + 1;
    } while (uVar19 < UF::length_);
  }
  (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar10;
  puVar8 = UF::P_;
  pMVar6 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  uVar10 = *(uint *)&pMVar6->field_0x8;
  uVar20 = uVar10 & 0xfffffffe;
  uVar16 = *(uint *)&pMVar6->field_0xc;
  local_e8 = uVar16 & 0x80000001;
  uVar25 = (long)(int)uVar16 & 0xfffffffffffffffe;
  uVar19 = 0;
  iVar17 = (int)uVar25;
  if (0 < (int)uVar20) {
    pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
    lVar11 = *(long *)&pMVar5->field_0x10;
    lVar21 = **(long **)&pMVar5->field_0x48;
    lVar7 = *(long *)&pMVar6->field_0x10;
    lVar1 = **(long **)&pMVar6->field_0x48;
    lVar28 = lVar7 + lVar1;
    lVar29 = lVar11 + 1 + lVar21;
    lVar13 = lVar11 + 1;
    uVar22 = 0;
    lVar26 = lVar7;
    do {
      puVar9 = UF::P_;
      lVar23 = lVar1 * uVar22 + lVar7;
      lVar12 = lVar23 + lVar1;
      if (iVar17 < 1) {
        uVar24 = 0;
      }
      else {
        uVar24 = 0;
        do {
          lVar30 = (long)*(int *)(lVar26 + uVar24 * 4);
          if (lVar30 < 1) {
            *(undefined8 *)(lVar26 + uVar24 * 4) = 0;
            uVar18 = uVar24 + 1;
            *(undefined4 *)(lVar28 + uVar24 * 4) = 0;
            uVar14 = 0;
          }
          else {
            uVar4 = puVar9[lVar30];
            uVar27 = uVar4;
            if (*(char *)(lVar13 + -1 + uVar24) == '\0') {
              uVar27 = 0;
            }
            *(uint *)(lVar26 + uVar24 * 4) = uVar27;
            uVar18 = uVar24 | 1;
            uVar27 = uVar4;
            if (*(char *)(lVar13 + uVar24) == '\0') {
              uVar27 = 0;
            }
            *(uint *)(lVar26 + 4 + uVar24 * 4) = uVar27;
            uVar27 = uVar4;
            if (*(char *)(lVar29 + -1 + uVar24) == '\0') {
              uVar27 = 0;
            }
            *(uint *)(lVar28 + uVar24 * 4) = uVar27;
            uVar15 = (ulong)uVar4;
            if (*(char *)(lVar29 + uVar24) == '\0') {
              uVar15 = uVar19;
            }
            uVar14 = (undefined4)uVar15;
          }
          *(undefined4 *)(lVar12 + uVar18 * 4) = uVar14;
          uVar24 = uVar24 + 2;
        } while ((long)uVar24 < (long)uVar25);
      }
      if (local_e8 == 1) {
        lVar30 = (long)*(int *)(lVar23 + uVar24 * 4);
        if (lVar30 < 1) {
          *(undefined4 *)(lVar23 + uVar24 * 4) = 0;
          *(undefined4 *)(lVar12 + uVar24 * 4) = 0;
        }
        else {
          lVar31 = lVar21 * uVar22 + lVar11;
          uVar4 = puVar8[lVar30];
          uVar18 = (ulong)uVar4;
          if (*(char *)(lVar31 + uVar24) == '\0') {
            uVar18 = uVar19;
          }
          *(int *)(lVar23 + uVar24 * 4) = (int)uVar18;
          if (*(char *)(lVar31 + lVar21 + uVar24) == '\0') {
            *(undefined4 *)(lVar12 + uVar24 * 4) = 0;
          }
          else {
            *(uint *)(lVar12 + uVar24 * 4) = uVar4;
          }
        }
      }
      uVar22 = uVar22 + 2;
      lVar28 = lVar28 + lVar1 * 2;
      lVar29 = lVar29 + lVar21 * 2;
      lVar13 = lVar13 + lVar21 * 2;
      lVar26 = lVar26 + lVar1 * 2;
    } while (uVar22 < uVar20);
    uVar19 = uVar22 & 0xffffffff;
  }
  puVar8 = UF::P_;
  if ((uVar10 & 0x80000001) == 1) {
    pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
    lVar28 = *(long *)&pMVar5->field_0x10;
    lVar21 = **(long **)&pMVar5->field_0x48 * uVar19;
    lVar29 = *(long *)&pMVar6->field_0x10;
    lVar11 = uVar19 * **(long **)&pMVar6->field_0x48;
    if (iVar17 < 1) {
      uVar19 = 0;
    }
    else {
      lVar7 = lVar21 + lVar28;
      lVar1 = lVar11 + lVar29;
      uVar19 = 0;
      do {
        lVar26 = (long)*(int *)(lVar1 + uVar19 * 4);
        if (lVar26 < 1) {
          *(undefined8 *)(lVar1 + uVar19 * 4) = 0;
        }
        else {
          uVar10 = puVar8[lVar26];
          uVar20 = uVar10;
          if (*(char *)(lVar7 + uVar19) == '\0') {
            uVar20 = 0;
          }
          *(uint *)(lVar1 + uVar19 * 4) = uVar20;
          if (*(char *)(lVar7 + 1 + uVar19) == '\0') {
            *(undefined4 *)(lVar1 + 4 + uVar19 * 4) = 0;
          }
          else {
            *(uint *)(lVar1 + 4 + uVar19 * 4) = uVar10;
          }
        }
        uVar19 = uVar19 + 2;
      } while (uVar19 < ((long)(int)uVar16 & 0xfffffffeU));
    }
    if (local_e8 == 1) {
      lVar29 = lVar29 + lVar11;
      lVar11 = (long)*(int *)(lVar29 + uVar19 * 4);
      uVar10 = 0;
      if ((0 < lVar11) && (uVar10 = 0, *(char *)(lVar28 + lVar21 + uVar19) != '\0')) {
        uVar10 = UF::P_[lVar11];
      }
      *(uint *)(lVar29 + uVar19 * 4) = uVar10;
    }
  }
  if (UF::P_ != (uint *)0x0) {
    operator_delete__(UF::P_);
  }
  return;
}

Assistant:

void PerformLabeling()
    {
        const int h = img_.rows;
        const int w = img_.cols;

        img_labels_ = cv::Mat1i(img_.size()); // Memory allocation for the output image

        LabelsSolver::Alloc(UPPER_BOUND_8_CONNECTIVITY); // Memory allocation of the labels solver
        LabelsSolver::Setup(); // Labels solver initialization

                               // We work with 2x2 blocks
                               // +-+-+-+
                               // |P|Q|R|
                               // +-+-+-+
                               // |S|X|
                               // +-+-+

                               // The pixels are named as follows
                               // +---+---+---+
                               // |a b|c d|e f|
                               // |g h|i j|k l|
                               // +---+---+---+
                               // |m n|o p|
                               // |q r|s t|
                               // +---+---+

                               // Pixels a, f, l, q are not needed, since we need to understand the
                               // the connectivity between these blocks and those pixels only matter
                               // when considering the outer connectivities

                               // A bunch of defines used to check if the pixels are foreground,
                               // without going outside the image limits.

                               // First scan
        for (int r = 0; r < h; r += 2) {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(r);
            const unsigned char* const img_row_prev = (unsigned char *)(((char *)img_row) - img_.step.p[0]);
            const unsigned char* const img_row_prev_prev = (unsigned char *)(((char *)img_row_prev) - img_.step.p[0]);
            const unsigned char* const img_row_fol = (unsigned char *)(((char *)img_row) + img_.step.p[0]);
            unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
            unsigned* const img_labels_row_prev_prev = (unsigned *)(((char *)img_labels_row) - img_labels_.step.p[0] - img_labels_.step.p[0]);

            for (int c = 0; c < w; c += 2) {

#define CONDITION_B c-1>=0 && r-2>=0 && img_row_prev_prev[c-1]>0
#define CONDITION_C r-2>=0 && img_row_prev_prev[c]>0
#define CONDITION_D c+1<w && r-2>=0 && img_row_prev_prev[c+1]>0
#define CONDITION_E c+2<w && r-2>=0 && img_row_prev_prev[c+2]>0

#define CONDITION_G c-2>=0 && r-1>=0 && img_row_prev[c-2]>0
#define CONDITION_H c-1>=0 && r-1>=0 && img_row_prev[c-1]>0
#define CONDITION_I r-1>=0 && img_row_prev[c]>0
#define CONDITION_J c+1<w && r-1>=0 && img_row_prev[c+1]>0
#define CONDITION_K c+2<w && r-1>=0 && img_row_prev[c+2]>0

#define CONDITION_M c-2>=0 && img_row[c-2]>0
#define CONDITION_N c-1>=0 && img_row[c-1]>0
#define CONDITION_O img_row[c]>0
#define CONDITION_P c+1<w && img_row[c+1]>0

#define CONDITION_R c-1>=0 && r+1<h && img_row_fol[c-1]>0
#define CONDITION_S r+1<h && img_row_fol[c]>0
#define CONDITION_T c+1<w && r+1<h && img_row_fol[c+1]>0

                // Action 1: No action
#define ACTION_1 img_labels_row[c] = 0; continue; 
                // Action 2: New label (the block has foreground pixels and is not connected to anything else)
#define ACTION_2 img_labels_row[c] = LabelsSolver::NewLabel(); continue; 
                //Action 3: Assign label of block P
#define ACTION_3 img_labels_row[c] = img_labels_row_prev_prev[c - 2]; continue;
                // Action 4: Assign label of block Q 
#define ACTION_4 img_labels_row[c] = img_labels_row_prev_prev[c]; continue;
                // Action 5: Assign label of block R
#define ACTION_5 img_labels_row[c] = img_labels_row_prev_prev[c + 2]; continue;
                // Action 6: Assign label of block S
#define ACTION_6 img_labels_row[c] = img_labels_row[c - 2]; continue; 
                // Action 7: Merge labels of block P and Q
#define ACTION_7 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]); continue;
                //Action 8: Merge labels of block P and R
#define ACTION_8 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c + 2]); continue;
                // Action 9 Merge labels of block P and S
#define ACTION_9 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row[c - 2]); continue;
                // Action 10 Merge labels of block Q and R
#define ACTION_10 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row_prev_prev[c + 2]); continue;
                // Action 11: Merge labels of block Q and S
#define ACTION_11 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row[c - 2]); continue;
                // Action 12: Merge labels of block R and S
#define ACTION_12 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c + 2], img_labels_row[c - 2]); continue;
                // Action 13: not used
#define ACTION_13 
                // Action 14: Merge labels of block P, Q and S
#define ACTION_14 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]), img_labels_row[c - 2]); continue;
                //Action 15: Merge labels of block P, R and S
#define ACTION_15 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c + 2]), img_labels_row[c - 2]); continue;
                //Action 16: labels of block Q, R and S
#define ACTION_16 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row_prev_prev[c + 2]), img_labels_row[c - 2]); continue;

#include "labeling_bolelli_2018_drag.inc.h"
            }
        }

        // Second scan
        n_labels_ = LabelsSolver::Flatten();

        int e_rows = img_labels_.rows & 0xfffffffe;
        bool o_rows = img_labels_.rows % 2 == 1;
        int e_cols = img_labels_.cols & 0xfffffffe;
        bool o_cols = img_labels_.cols % 2 == 1;

        int r = 0;
        for (; r < e_rows; r += 2) {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(r);
            const unsigned char* const img_row_fol = (unsigned char *)(((char *)img_row) + img_.step.p[0]);

            unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
            unsigned* const img_labels_row_fol = (unsigned *)(((char *)img_labels_row) + img_labels_.step.p[0]);
            int c = 0;
            for (; c < e_cols; c += 2) {
                int iLabel = img_labels_row[c];
                if (iLabel > 0) {
                    iLabel = LabelsSolver::GetLabel(iLabel);
                    if (img_row[c] > 0)
                        img_labels_row[c] = iLabel;
                    else
                        img_labels_row[c] = 0;
                    if (img_row[c + 1] > 0)
                        img_labels_row[c + 1] = iLabel;
                    else
                        img_labels_row[c + 1] = 0;
                    if (img_row_fol[c] > 0)
                        img_labels_row_fol[c] = iLabel;
                    else
                        img_labels_row_fol[c] = 0;
                    if (img_row_fol[c + 1] > 0)
                        img_labels_row_fol[c + 1] = iLabel;
                    else
                        img_labels_row_fol[c + 1] = 0;
                }
                else {
                    img_labels_row[c] = 0;
                    img_labels_row[c + 1] = 0;
                    img_labels_row_fol[c] = 0;
                    img_labels_row_fol[c + 1] = 0;
                }
            }
            // Last column if the number of columns is odd
            if (o_cols) {
                int iLabel = img_labels_row[c];
                if (iLabel > 0) {
                    iLabel = LabelsSolver::GetLabel(iLabel);
                    if (img_row[c] > 0)
                        img_labels_row[c] = iLabel;
                    else
                        img_labels_row[c] = 0;
                    if (img_row_fol[c] > 0)
                        img_labels_row_fol[c] = iLabel;
                    else
                        img_labels_row_fol[c] = 0;
                }
                else {
                    img_labels_row[c] = 0;
                    img_labels_row_fol[c] = 0;
                }
            }
        }
        // Last row if the number of rows is odd
        if (o_rows) {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(r);
            unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
            int c = 0;
            for (; c < e_cols; c += 2) {
                int iLabel = img_labels_row[c];
                if (iLabel > 0) {
                    iLabel = LabelsSolver::GetLabel(iLabel);
                    if (img_row[c] > 0)
                        img_labels_row[c] = iLabel;
                    else
                        img_labels_row[c] = 0;
                    if (img_row[c + 1] > 0)
                        img_labels_row[c + 1] = iLabel;
                    else
                        img_labels_row[c + 1] = 0;
                }
                else {
                    img_labels_row[c] = 0;
                    img_labels_row[c + 1] = 0;
                }
            }
            // Last column if the number of columns is odd
            if (o_cols) {
                int iLabel = img_labels_row[c];
                if (iLabel > 0) {
                    iLabel = LabelsSolver::GetLabel(iLabel);
                    if (img_row[c] > 0)
                        img_labels_row[c] = iLabel;
                    else
                        img_labels_row[c] = 0;
                }
                else {
                    img_labels_row[c] = 0;
                }
            }
        }

        LabelsSolver::Dealloc();

#undef ACTION_1
#undef ACTION_2
#undef ACTION_3
#undef ACTION_4
#undef ACTION_5
#undef ACTION_6
#undef ACTION_7
#undef ACTION_8
#undef ACTION_9
#undef ACTION_10
#undef ACTION_11
#undef ACTION_12
#undef ACTION_13
#undef ACTION_14
#undef ACTION_15
#undef ACTION_16


#undef CONDITION_B
#undef CONDITION_C
#undef CONDITION_D
#undef CONDITION_E

#undef CONDITION_G
#undef CONDITION_H
#undef CONDITION_I
#undef CONDITION_J
#undef CONDITION_K

#undef CONDITION_M
#undef CONDITION_N
#undef CONDITION_O
#undef CONDITION_P

#undef CONDITION_R
#undef CONDITION_S
#undef CONDITION_T
    }